

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

ssize_t __thiscall pybind11::array::shape(array *this,ssize_t dim)

{
  PyObject *pPVar1;
  allocator<char> local_39;
  string local_38;
  
  pPVar1 = (this->super_buffer).super_object.super_handle.m_ptr;
  if (*(int *)&pPVar1[1].ob_type <= dim) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"invalid axis",&local_39)
    ;
    fail_dim_check(this,dim,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pPVar1 = (this->super_buffer).super_object.super_handle.m_ptr;
  }
  return *(ssize_t *)(pPVar1[2].ob_refcnt + dim * 8);
}

Assistant:

ssize_t shape(ssize_t dim) const {
        if (dim >= ndim())
            fail_dim_check(dim, "invalid axis");
        return shape()[dim];
    }